

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest18_19::verifyXFBData
          (FunctionalTest18_19 *this,GLvoid *data,GLuint bool_operator1_subroutine_location,
          GLuint bool_operator2_subroutine_location,GLuint vec4_operator1_subroutine_location,
          GLuint vec4_operator2_subroutine_location)

{
  GLuint GVar1;
  TestLog *pTVar2;
  MessageBuilder *this_00;
  int iVar3;
  int iVar4;
  uint iteration;
  ulong uVar5;
  code *pcVar6;
  ulong uVar7;
  code *pcVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float *local_240;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  Vector<float,_4> local_1e8;
  undefined1 local_1d8 [16];
  Vector<float,_4> local_1c8;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  
  GVar1 = this->m_po_subroutine_returns_true_location;
  pcVar6 = vec4operator_mul4;
  pcVar8 = vec4operator_mul4;
  if (this->m_po_subroutine_divide_by_two_location == vec4_operator1_subroutine_location) {
    pcVar8 = vec4operator_div2;
  }
  if (this->m_po_subroutine_divide_by_two_location == vec4_operator2_subroutine_location) {
    pcVar6 = vec4operator_div2;
  }
  iVar4 = 0;
  local_240 = (float *)data;
  for (uVar7 = 0; uVar7 < this->m_n_points_to_draw; uVar7 = uVar7 + 1) {
    if (GVar1 == bool_operator1_subroutine_location) {
      fVar12 = (float)((int)uVar7 * 6 + 2);
      do {
        fVar12 = fVar12 / (float)((int)uVar7 + 2);
      } while (1.0 < fVar12);
    }
    else {
      local_1b8._0_4_ = (undefined4)(uVar7 & 0xffffffff);
      fStack_1ac = (float)local_1b8._0_4_ + 3.0;
      local_1b8._4_4_ = (float)local_1b8._0_4_ + 1.0;
      fStack_1b0 = (float)local_1b8._0_4_ + 2.0;
      iVar3 = iVar4;
      if ((uVar7 & 1) == 0) {
        if (GVar1 == bool_operator2_subroutine_location) {
          for (uVar5 = 0; uVar7 != uVar5; uVar5 = (ulong)((int)uVar5 + 1)) {
            tcu::Vector<float,_4>::Vector(&local_1c8,(Vector<float,_4> *)local_1b8);
            (*pcVar8)(local_1f8,&local_1c8);
            (*pcVar6)(local_208,local_1f8);
            local_1b8._0_4_ = (undefined4)local_208._0_8_;
            local_1b8._4_4_ = SUB84(local_208._0_8_,4);
            fStack_1b0 = (float)local_208._8_8_;
            fStack_1ac = SUB84(local_208._8_8_,4);
          }
        }
      }
      else {
        while (bVar9 = iVar3 != 0, iVar3 = iVar3 + -1, bVar9) {
          tcu::Vector<float,_4>::Vector(&local_1e8,(Vector<float,_4> *)local_1b8);
          (*pcVar6)(local_1d8,&local_1e8);
          (*pcVar8)(local_208,local_1d8);
          local_1b8._0_4_ = (undefined4)local_208._0_8_;
          local_1b8._4_4_ = SUB84(local_208._0_8_,4);
          fStack_1b0 = (float)local_208._8_8_;
          fStack_1ac = SUB84(local_208._8_8_,4);
        }
      }
      fVar12 = (float)local_1b8._0_4_ + (float)local_1b8._4_4_ + fStack_1b0 + fStack_1ac;
    }
    fVar10 = fVar12 - *local_240;
    fVar11 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar11 = fVar10;
    }
    if (1e-05 < fVar11) {
      pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_1b8._0_4_ = SUB84(pTVar2,0);
      local_1b8._4_4_ = (undefined4)((ulong)pTVar2 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
      std::operator<<((ostream *)&fStack_1b0,"XFBed data was found to be invalid at index [");
      std::ostream::_M_insert<unsigned_long>((ulong)&fStack_1b0);
      std::operator<<((ostream *)&fStack_1b0,
                      "]for the following subroutine location configuration: bool_operator1_subroutine_location:["
                     );
      std::ostream::_M_insert<unsigned_long>((ulong)&fStack_1b0);
      std::operator<<((ostream *)&fStack_1b0,"] bool_operator2_subroutine_location:[");
      std::ostream::_M_insert<unsigned_long>((ulong)&fStack_1b0);
      std::operator<<((ostream *)&fStack_1b0,"] vec4_operator1_subroutine_location:[");
      std::ostream::_M_insert<unsigned_long>((ulong)&fStack_1b0);
      std::operator<<((ostream *)&fStack_1b0,"] vec4_operator2_subroutine_location:[");
      std::ostream::_M_insert<unsigned_long>((ulong)&fStack_1b0);
      std::operator<<((ostream *)&fStack_1b0,"]; expected data:");
      std::ostream::operator<<((ostringstream *)&fStack_1b0,fVar12);
      std::operator<<((ostream *)&fStack_1b0,", found:");
      this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b8,local_240);
      tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
      this->m_has_test_passed = false;
    }
    local_240 = local_240 + 1;
    iVar4 = iVar4 + 2;
  }
  return;
}

Assistant:

void FunctionalTest18_19::verifyXFBData(const glw::GLvoid* data, glw::GLuint bool_operator1_subroutine_location,
										glw::GLuint bool_operator2_subroutine_location,
										glw::GLuint vec4_operator1_subroutine_location,
										glw::GLuint vec4_operator2_subroutine_location)
{
	bool				bool_operator1_result = false;
	bool				bool_operator2_result = false;
	const float			epsilon				  = 1e-5f;
	PFNVEC4OPERATORPROC pVec4Operator1		  = NULL;
	PFNVEC4OPERATORPROC pVec4Operator2		  = NULL;
	const glw::GLfloat* traveller_ptr		  = (const glw::GLfloat*)data;

	bool_operator1_result = (bool_operator1_subroutine_location == m_po_subroutine_returns_true_location);
	bool_operator2_result = (bool_operator2_subroutine_location == m_po_subroutine_returns_true_location);
	pVec4Operator1		  = (vec4_operator1_subroutine_location == m_po_subroutine_divide_by_two_location) ?
						 vec4operator_div2 :
						 vec4operator_mul4;
	pVec4Operator2 = (vec4_operator2_subroutine_location == m_po_subroutine_divide_by_two_location) ?
						 vec4operator_div2 :
						 vec4operator_mul4;

	for (unsigned int n_vertex = 0; n_vertex < m_n_points_to_draw; ++n_vertex)
	{
		float expected_value = 0.0f;

		if (bool_operator1_result)
		{
			float value = float((3 * n_vertex + 1) * 2);

			while (bool_operator1_result)
			{
				value /= float(n_vertex + 2);

				if (value <= 1.0f)
					break;
			}

			expected_value = value;
		}
		else
		{
			tcu::Vec4 value((float)n_vertex, (float)n_vertex + 1, (float)n_vertex + 2, (float)n_vertex + 3);

			switch (n_vertex % 2)
			{
			case 0:
			{
				for (unsigned int iteration = 0; iteration < n_vertex && bool_operator2_result; ++iteration)
				{
					value = pVec4Operator2(pVec4Operator1(value));
				}

				break;
			}

			case 1:
			{
				for (unsigned int iteration = 0; iteration < n_vertex * 2; ++iteration)
				{
					value = pVec4Operator1(pVec4Operator2(value));
				}

				break;
			}
			} /* switch (n_vertex % 2) */

			expected_value = value.x() + value.y() + value.z() + value.w();
		}

		if (de::abs(expected_value - *traveller_ptr) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "XFBed data was found to be invalid at index [" << n_vertex
							   << "]"
								  "for the following subroutine location configuration:"
								  " bool_operator1_subroutine_location:["
							   << bool_operator1_subroutine_location << "]"
																		" bool_operator2_subroutine_location:["
							   << bool_operator2_subroutine_location << "]"
																		" vec4_operator1_subroutine_location:["
							   << vec4_operator1_subroutine_location << "]"
																		" vec4_operator2_subroutine_location:["
							   << vec4_operator2_subroutine_location << "];"
																		" expected data:"
							   << expected_value << ", found:" << *traveller_ptr << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		++traveller_ptr;
	} /* for (all drawn points) */
}